

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_quake.cpp
# Opt level: O1

int DEarthquake::StaticGetQuakeIntensities(AActor *victim,FQuakeJiggers *jiggers)

{
  uint uVar1;
  AActor *pAVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  DEarthquake *this;
  int iVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  TThinkerIterator<DEarthquake> iterator;
  FThinkerIterator local_48;
  
  if ((victim->player == (player_t *)0x0) || (iVar8 = 0, (victim->player->cheats & 1) == 0)) {
    FThinkerIterator::FThinkerIterator(&local_48,RegistrationInfo.MyClass,0x28);
    iVar8 = 0;
    this = (DEarthquake *)FThinkerIterator::Next(&local_48,false);
    if (this != (DEarthquake *)0x0) {
      iVar8 = 0;
      do {
        pAVar2 = (this->m_Spot).field_0.p;
        if (pAVar2 != (AActor *)0x0) {
          if (((pAVar2->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
            pAVar2 = (this->m_Spot).field_0.p;
            dVar9 = (pAVar2->__Pos).X - (victim->__Pos).X;
            dVar3 = (pAVar2->__Pos).Y - (victim->__Pos).Y;
            dVar3 = c_sqrt(dVar3 * dVar3 + dVar9 * dVar9);
            if (dVar3 < this->m_TremorRadius) {
              iVar8 = iVar8 + 1;
              dVar3 = GetFalloff(this,dVar3);
              dVar9 = GetModIntensity(this,this->m_RollIntensity,false);
              dVar11 = GetModIntensity(this,1.0,true);
              dVar4 = GetModIntensity(this,(this->m_Intensity).X,false);
              dVar10 = GetModIntensity(this,(this->m_Intensity).Y,false);
              dVar5 = GetModIntensity(this,(this->m_Intensity).Z,false);
              uVar1 = this->m_Flags;
              if ((uVar1 & 0x20) == 0) {
                if (dVar9 <= jiggers->RollIntensity) {
                  dVar9 = jiggers->RollIntensity;
                }
                jiggers->RollIntensity = dVar9 * dVar3;
                dVar4 = dVar4 * dVar3;
                dVar10 = dVar10 * dVar3;
                dVar5 = dVar5 * dVar3;
                if ((uVar1 & 1) == 0) {
                  dVar3 = (jiggers->Intensity).X;
                  if (dVar4 <= dVar3) {
                    dVar4 = dVar3;
                  }
                  (jiggers->Intensity).X = dVar4;
                  dVar3 = (jiggers->Intensity).Y;
                  if (dVar10 <= dVar3) {
                    dVar10 = dVar3;
                  }
                  (jiggers->Intensity).Y = dVar10;
                  dVar3 = (jiggers->Intensity).Z;
                  if (dVar5 <= dVar3) {
                    dVar5 = dVar3;
                  }
                  (jiggers->Intensity).Z = dVar5;
                }
                else {
                  dVar3 = (jiggers->RelIntensity).X;
                  if (dVar4 <= dVar3) {
                    dVar4 = dVar3;
                  }
                  (jiggers->RelIntensity).X = dVar4;
                  dVar3 = (jiggers->RelIntensity).Y;
                  if (dVar10 <= dVar3) {
                    dVar10 = dVar3;
                  }
                  (jiggers->RelIntensity).Y = dVar10;
                  dVar3 = (jiggers->RelIntensity).Z;
                  if (dVar5 <= dVar3) {
                    dVar5 = dVar3;
                  }
                  (jiggers->RelIntensity).Z = dVar5;
                }
              }
              else {
                dVar6 = FFastTrig::sin(&fasttrig,dVar5);
                jiggers->RollWave = dVar9 * dVar6 * dVar3 * dVar11;
                dVar9 = FFastTrig::sin(&fasttrig,
                                       ((double)this->m_Countdown - r_TicFracF) *
                                       (this->m_WaveSpeed).X * 0.17951958020513104 *
                                       683565275.5764316 + 6755399441055744.0);
                dVar6 = FFastTrig::sin(&fasttrig,
                                       ((double)this->m_Countdown - r_TicFracF) *
                                       (this->m_WaveSpeed).Y * 0.17951958020513104 *
                                       683565275.5764316 + 6755399441055744.0);
                dVar7 = FFastTrig::sin(&fasttrig,
                                       ((double)this->m_Countdown - r_TicFracF) *
                                       (this->m_WaveSpeed).Z * 0.17951958020513104 *
                                       683565275.5764316 + 6755399441055744.0);
                dVar3 = dVar3 * dVar11;
                dVar9 = dVar4 * dVar9 * dVar3;
                dVar11 = dVar10 * dVar6 * dVar3;
                dVar3 = dVar3 * dVar5 * dVar7;
                if ((this->m_Flags & 1) == 0) {
                  (jiggers->Offset).X = dVar9 + (jiggers->Offset).X;
                  (jiggers->Offset).Y = dVar11 + (jiggers->Offset).Y;
                  (jiggers->Offset).Z = dVar3 + (jiggers->Offset).Z;
                }
                else {
                  (jiggers->RelOffset).X = dVar9 + (jiggers->RelOffset).X;
                  (jiggers->RelOffset).Y = dVar11 + (jiggers->RelOffset).Y;
                  (jiggers->RelOffset).Z = dVar3 + (jiggers->RelOffset).Z;
                }
              }
            }
          }
          else {
            (this->m_Spot).field_0.p = (AActor *)0x0;
          }
        }
        this = (DEarthquake *)FThinkerIterator::Next(&local_48,false);
      } while (this != (DEarthquake *)0x0);
    }
  }
  return iVar8;
}

Assistant:

int DEarthquake::StaticGetQuakeIntensities(AActor *victim, FQuakeJiggers &jiggers)
{
	if (victim->player != NULL && (victim->player->cheats & CF_NOCLIP))
	{
		return 0;
	}

	TThinkerIterator<DEarthquake> iterator(STAT_EARTHQUAKE);
	DEarthquake *quake;
	int count = 0;

	while ( (quake = iterator.Next()) != nullptr)
	{
		if (quake->m_Spot != nullptr)
		{
			const double dist = quake->m_Spot->Distance2D(victim, true);
			if (dist < quake->m_TremorRadius)
			{
				++count;
				const double falloff = quake->GetFalloff(dist);
				const double r = quake->GetModIntensity(quake->m_RollIntensity);
				const double strength = quake->GetModIntensity(1.0, true);
				DVector3 intensity;
				intensity.X = quake->GetModIntensity(quake->m_Intensity.X);
				intensity.Y = quake->GetModIntensity(quake->m_Intensity.Y);
				intensity.Z = quake->GetModIntensity(quake->m_Intensity.Z);

				if (!(quake->m_Flags & QF_WAVE))
				{
					jiggers.RollIntensity = MAX(r, jiggers.RollIntensity) * falloff;

					intensity *= falloff;
					if (quake->m_Flags & QF_RELATIVE)
					{
						jiggers.RelIntensity.X = MAX(intensity.X, jiggers.RelIntensity.X);
						jiggers.RelIntensity.Y = MAX(intensity.Y, jiggers.RelIntensity.Y);
						jiggers.RelIntensity.Z = MAX(intensity.Z, jiggers.RelIntensity.Z);
					}
					else
					{
						jiggers.Intensity.X = MAX(intensity.X, jiggers.Intensity.X);
						jiggers.Intensity.Y = MAX(intensity.Y, jiggers.Intensity.Y);
						jiggers.Intensity.Z = MAX(intensity.Z, jiggers.Intensity.Z);
					}
				}
				else
				{
					jiggers.RollWave = r * quake->GetModWave(quake->m_RollWave) * falloff * strength;

					
					intensity.X *= quake->GetModWave(quake->m_WaveSpeed.X);
					intensity.Y *= quake->GetModWave(quake->m_WaveSpeed.Y);
					intensity.Z *= quake->GetModWave(quake->m_WaveSpeed.Z);
					intensity *= strength * falloff;

					// [RH] This only gives effect to the last sine quake. I would
					// prefer if some way was found to make multiples coexist
					// peacefully, but just summing them together is undesirable
					// because they could cancel each other out depending on their
					// relative phases.

					// [MC] Now does so. And they stack rather well. I'm a little
					// surprised at how easy it was.

					
					if (quake->m_Flags & QF_RELATIVE)
					{
						jiggers.RelOffset += intensity;
					}
					else
					{
						jiggers.Offset += intensity;
					}
				}
			}
		}
	}
	return count;
}